

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.h
# Opt level: O3

void __thiscall
bloaty::dwarf::CompilationUnitSizes::SetAddressSize(CompilationUnitSizes *this,uint8_t address_size)

{
  Nonnull<char_*> pcVar1;
  int iVar2;
  undefined7 in_register_00000031;
  Arg *in_R8;
  string_view format;
  string local_58;
  long local_38;
  Nonnull<char_*> local_30;
  char local_28 [32];
  
  iVar2 = (int)CONCAT71(in_register_00000031,address_size);
  if ((iVar2 != 4) && (iVar2 != 8)) {
    pcVar1 = absl::numbers_internal::FastIntToBuffer((uint)address_size,local_28);
    local_38 = (long)pcVar1 - (long)local_28;
    format._M_str = (char *)&local_38;
    format._M_len = (size_t)"Unexpected address size: $0";
    local_30 = local_28;
    absl::Substitute_abi_cxx11_(&local_58,(absl *)0x1b,format,in_R8);
    Throw(local_58._M_dataplus._M_p,0x70);
  }
  this->addr8_ = address_size == '\b';
  return;
}

Assistant:

void SetAddressSize(uint8_t address_size) {
    if (address_size != 4 && address_size != 8) {
      THROWF("Unexpected address size: $0", address_size);
    }
    addr8_ = address_size == 8;
  }